

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O3

void __thiscall LatencyCollector::LatencyCollector(LatencyCollector *this)

{
  __pointer_type pMVar1;
  ashared_ptr<MapWrapper> local_40;
  
  *(undefined8 *)((long)&(this->latestMap).lock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->latestMap).lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->latestMap).lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->latestMap).lock.super___mutex_base._M_mutex + 8) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->latestMap).object._M_b._M_p = (__pointer_type)0x0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  (this->latestMap).lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  pMVar1 = (__pointer_type)operator_new(0x38);
  (pMVar1->map)._M_h._M_buckets = &(pMVar1->map)._M_h._M_single_bucket;
  (pMVar1->map)._M_h._M_bucket_count = 1;
  (pMVar1->map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pMVar1->map)._M_h._M_element_count = 0;
  (pMVar1->map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pMVar1->map)._M_h._M_rehash_policy._M_next_resize = 0;
  (pMVar1->map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_40.object._M_b._M_p = (__base_type)operator_new(0x10);
  (((__pointer_type)local_40.object._M_b._M_p)->ptr)._M_b._M_p = pMVar1;
  (((__pointer_type)local_40.object._M_b._M_p)->refCount).super___atomic_base<unsigned_long>._M_i =
       1;
  local_40.lock.super___mutex_base._M_mutex.__align = 0;
  local_40.lock.super___mutex_base._M_mutex._8_8_ = 0;
  local_40.lock.super___mutex_base._M_mutex._16_8_ = 0;
  local_40.lock.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_40.lock.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  ashared_ptr<MapWrapper>::operator=(&this->latestMap,&local_40);
  ashared_ptr<MapWrapper>::reset(&local_40);
  return;
}

Assistant:

LatencyCollector() {
        latestMap = MapWrapperSP(new MapWrapper());
    }